

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

istream * operator>>(istream *stream,Msk4Header *header)

{
  int iVar1;
  runtime_error *this;
  Msk4HeaderSwitch h;
  undefined1 local_34 [16];
  undefined4 local_24;
  undefined8 local_20;
  
  iVar1 = detectSwitch(stream);
  if (-1 < iVar1) {
    std::istream::read((char *)stream,(long)local_34);
    header->width = (undefined2)local_24;
    header->height = local_24._2_2_;
    header->dataOffset = (undefined4)local_20;
    header->dataSize = local_20._4_4_;
    return stream;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"PS3 MSK4 decoding is unsupported");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::istream& operator>>(std::istream& stream, Msk4Header& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		throw std::runtime_error("PS3 MSK4 decoding is unsupported");
	} else { // Switch
		auto h = readRaw<Msk4HeaderSwitch>(stream);
		header.width = h.width.value();
		header.height = h.height.value();
		header.dataOffset = h.dataOffset.value();
		header.dataSize = h.dataSize.value();
	}
	return stream;
}